

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O2

CURLcode formboundary(Curl_easy *data,char *buffer,size_t buflen)

{
  CURLcode CVar1;
  
  builtin_strncpy(buffer,"------------------------",0x18);
  CVar1 = Curl_rand_hex(data,(uchar *)(buffer + 0x18),0x11);
  return CVar1;
}

Assistant:

static CURLcode formboundary(struct Curl_easy *data,
                             char *buffer, size_t buflen)
{
  /* 24 dashes and 16 hexadecimal digits makes 64 bit (18446744073709551615)
     combinations */
  if(buflen < 41)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  memset(buffer, '-', 24);
  Curl_rand_hex(data, (unsigned char *)&buffer[24], 17);

  return CURLE_OK;
}